

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

isoent * isoent_find_entry(isoent *rootent,char *fn)

{
  char cVar1;
  int iVar2;
  char *in_RDX;
  char *extraout_RDX;
  char name [256];
  char acStack_138 [264];
  
  do {
    iVar2 = get_path_component(acStack_138,(size_t)fn,in_RDX);
    if (iVar2 == 0) {
      return (isoent *)0x0;
    }
    cVar1 = fn[iVar2];
    rootent = (isoent *)__archive_rb_tree_find_node(&rootent->rbtree,acStack_138);
    if (rootent == (isoent *)0x0) {
      return (isoent *)0x0;
    }
    fn = fn + (ulong)(cVar1 == '/') + (long)iVar2;
    if (*fn == '\0') {
      return rootent;
    }
    in_RDX = extraout_RDX;
  } while ((rootent->field_0xe8 & 2) != 0);
  return (isoent *)0x0;
}

Assistant:

static struct isoent *
isoent_find_entry(struct isoent *rootent, const char *fn)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	char name[_MAX_FNAME];/* Included null terminator size. */
#elif defined(NAME_MAX) && NAME_MAX >= 255
	char name[NAME_MAX+1];
#else
	char name[256];
#endif
	struct isoent *isoent, *np;
	int l;

	isoent = rootent;
	np = NULL;
	for (;;) {
		l = get_path_component(name, sizeof(name), fn);
		if (l == 0)
			break;
		fn += l;
		if (fn[0] == '/')
			fn++;

		np = isoent_find_child(isoent, name);
		if (np == NULL)
			break;
		if (fn[0] == '\0')
			break;/* We found out the entry */

		/* Try sub directory. */
		isoent = np;
		np = NULL;
		if (!isoent->dir)
			break;/* Not directory */
	}

	return (np);
}